

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void dofiretrap(obj *box)

{
  undefined1 uVar1;
  boolean bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  int tmp;
  int iVar6;
  int iVar7;
  char *pcVar8;
  bool give_feedback;
  
  uVar1 = u._1052_1_;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00266707;
    give_feedback = true;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00266702;
  }
  else {
LAB_00266702:
    if (ublindf == (obj *)0x0) {
      give_feedback = false;
    }
    else {
LAB_00266707:
      give_feedback = ublindf->oartifact == '\x1d';
    }
  }
  if (box == (obj *)0x0) {
    pcVar5 = surface((int)u.ux,(int)u.uy);
    if ((uVar1 & 2) != 0) goto LAB_00266888;
    pcVar8 = "erupts";
  }
  else {
    if (box->where == '\x03') {
      bVar3 = u._1052_1_ & 2;
    }
    else {
      bVar3 = is_pool(level,(int)box->ox,(int)box->oy);
    }
    if (bVar3 != 0) {
      pcVar5 = xname(box);
LAB_00266888:
      pcVar5 = the(pcVar5);
      pline("A cascade of steamy bubbles erupts from %s!",pcVar5);
      if (u.uprops[1].extrinsic != 0 || u.uprops[1].intrinsic != 0) {
        return;
      }
      if (((byte)youmonst.mintrinsics & 1) != 0) {
        return;
      }
      uVar4 = mt_random();
      losehp(uVar4 % 3 + 1,"boiling water",1);
      return;
    }
    pcVar5 = xname(box);
    pcVar8 = "bursts";
  }
  the(pcVar5);
  pline("A %s %s from %s!","tower of flame",pcVar8);
  iVar6 = 2;
  iVar7 = -2;
  do {
    uVar4 = mt_random();
    iVar6 = iVar6 + (uVar4 & 3);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0);
  fire_damageu(iVar6,(monst *)0x0,"tower of flame",0,0x14,'\x01','\x01');
  if ((box == (obj *)0x0) &&
     (iVar6 = burn_floor_paper((int)u.ux,(int)u.uy,give_feedback,'\x01'),
     give_feedback == false && iVar6 != 0)) {
    pline("You smell paper burning.");
  }
  bVar2 = is_ice(level,(int)u.ux,(int)u.uy);
  if (bVar2 == '\0') {
    return;
  }
  melt_ice(u.ux,u.uy);
  return;
}

Assistant:

static void dofiretrap(struct obj *box)
{
	boolean see_it = !Blind;

/* Bug: for box case, the equivalent of burn_floor_paper() ought
 * to be done upon its contents.
 */

	if ((box && !carried(box)) ? is_pool(level, box->ox, box->oy) : Underwater) {
	    pline("A cascade of steamy bubbles erupts from %s!",
		    the(box ? xname(box) : surface(u.ux,u.uy)));
	    if (!Fire_resistance)
		losehp(rnd(3), "boiling water", KILLED_BY);
	    return;
	}
	pline("A %s %s from %s!", tower_of_flame,
	      box ? "bursts" : "erupts",
	      the(box ? xname(box) : surface(u.ux,u.uy)));
	fire_damageu(dice(2, 4), NULL, tower_of_flame, KILLED_BY_AN, 20, TRUE, TRUE);
	if (!box && burn_floor_paper(u.ux, u.uy, see_it, TRUE) && !see_it)
	    pline("You smell paper burning.");
	if (is_ice(level, u.ux, u.uy))
	    melt_ice(u.ux, u.uy);
}